

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O1

Instruction * __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::CreateAccessChainWithIndex
          (InterfaceVariableScalarReplacement *this,uint32_t component_type_id,Instruction *var,
          uint32_t index,Instruction *insert_before)

{
  IRContext *pIVar1;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> inst;
  InterfaceVariableScalarReplacement *pIVar2;
  StorageClass storage_class;
  uint32_t uVar3;
  array<signed_char,_4UL> aVar4;
  uint32_t res_id;
  pointer pOVar5;
  pointer *__ptr;
  default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *this_00;
  long lVar6;
  Operand *__cur;
  SmallVector<unsigned_int,_2UL> *this_01;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  new_access_chain;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_120;
  IRContext *local_118;
  Instruction *local_110;
  InterfaceVariableScalarReplacement *local_108;
  Instruction *local_100;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_f8;
  undefined1 local_e0 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_c0;
  undefined1 local_b8 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_98;
  undefined4 local_90;
  SmallVector<unsigned_int,_2UL> local_88;
  undefined4 local_60;
  undefined1 local_58 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_38;
  
  uVar3 = (var->has_result_id_ & 1) + 1;
  if (var->has_type_id_ == false) {
    uVar3 = (uint)var->has_result_id_;
  }
  local_100 = insert_before;
  storage_class = Instruction::GetSingleWordOperand(var,uVar3);
  uVar3 = GetPointerType(this,component_type_id,storage_class);
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisConstants) == kAnalysisNone) {
    IRContext::BuildConstantManager(pIVar1);
  }
  aVar4._M_elems =
       (_Type)analysis::ConstantManager::GetUIntConstId
                        ((pIVar1->constant_mgr_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                         .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>.
                         _M_head_impl,index);
  local_110 = (Instruction *)operator_new(0x70);
  local_118 = (this->super_Pass).context_;
  local_108 = this;
  res_id = Pass::TakeNextId(&this->super_Pass);
  local_b8[0x10] = '\0';
  local_b8[0x11] = '\0';
  local_b8[0x12] = '\0';
  local_b8[0x13] = '\0';
  if (var->has_result_id_ == true) {
    local_b8._16_4_ = Instruction::GetSingleWordOperand(var,(uint)var->has_type_id_);
  }
  local_b8._24_8_ = local_b8 + 0x10;
  local_b8._0_8_ = &PTR__SmallVector_009488e0;
  local_98._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  local_b8._8_8_ = 1;
  this_01 = &local_88;
  local_90 = 1;
  local_88._vptr_SmallVector = (_func_int **)&PTR__SmallVector_009488e0;
  local_88.size_ = 0;
  local_88.small_data_ = (uint *)local_88.buffer;
  local_88.large_data_._M_t.
  super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            (this_01,(SmallVector<unsigned_int,_2UL> *)local_b8);
  local_e0._24_8_ = local_e0 + 0x10;
  local_e0._0_8_ = &PTR__SmallVector_009488e0;
  local_c0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_e0._8_8_ = 1;
  local_60 = 1;
  local_58._0_8_ = &PTR__SmallVector_009488e0;
  local_58._8_8_ = 0;
  local_58._24_8_ = local_58 + 0x10;
  local_38._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  local_e0._16_4_ = aVar4._M_elems;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)local_58,(SmallVector<unsigned_int,_2UL> *)local_e0);
  local_f8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar6 = 0x60;
  pOVar5 = (pointer)operator_new(0x60);
  local_f8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = pOVar5 + 2;
  local_f8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = pOVar5;
  do {
    pOVar5->type = *(spv_operand_type_t *)
                    &this_01[-1].large_data_._M_t.
                     super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     .
                     super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                     ._M_head_impl;
    (pOVar5->words)._vptr_SmallVector = (_func_int **)&PTR__SmallVector_009488e0;
    (pOVar5->words).size_ = 0;
    (pOVar5->words).small_data_ = (uint *)(pOVar5->words).buffer;
    (pOVar5->words).large_data_._M_t.
    super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=(&pOVar5->words,this_01);
    local_120._M_head_impl = local_110;
    pOVar5 = pOVar5 + 1;
    this_01 = (SmallVector<unsigned_int,_2UL> *)&this_01[1].size_;
    lVar6 = lVar6 + -0x30;
  } while (lVar6 != 0);
  local_f8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = pOVar5;
  Instruction::Instruction(local_110,local_118,OpAccessChain,uVar3,res_id,&local_f8);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_f8);
  pIVar2 = local_108;
  lVar6 = -0x60;
  this_00 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)&local_38;
  do {
    *(undefined ***)(this_00 + -0x20) = &PTR__SmallVector_009488e0;
    if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_00 !=
        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                (this_00,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_00);
    }
    *(undefined8 *)this_00 = 0;
    this_00 = this_00 + -0x30;
    lVar6 = lVar6 + 0x30;
  } while (lVar6 != 0);
  local_e0._0_8_ = &PTR__SmallVector_009488e0;
  if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )local_c0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_c0,local_c0._M_head_impl);
  }
  local_b8._0_8_ = &PTR__SmallVector_009488e0;
  if (local_98._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl !=
      (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_98,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               local_98._M_t.
               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               .
               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
               ._M_head_impl);
  }
  inst._M_head_impl = local_120._M_head_impl;
  pIVar1 = (pIVar2->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  analysis::DefUseManager::AnalyzeInstDefUse
            ((pIVar1->def_use_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
             inst._M_head_impl);
  Instruction::InsertBefore
            (local_100,
             (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              *)&local_120);
  if (local_120._M_head_impl != (Instruction *)0x0) {
    (*((local_120._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
      _vptr_IntrusiveNodeBase[1])();
  }
  return inst._M_head_impl;
}

Assistant:

Instruction* InterfaceVariableScalarReplacement::CreateAccessChainWithIndex(
    uint32_t component_type_id, Instruction* var, uint32_t index,
    Instruction* insert_before) {
  uint32_t ptr_type_id =
      GetPointerType(component_type_id, GetStorageClass(var));
  uint32_t index_id = context()->get_constant_mgr()->GetUIntConstId(index);
  std::unique_ptr<Instruction> new_access_chain(new Instruction(
      context(), spv::Op::OpAccessChain, ptr_type_id, TakeNextId(),
      std::initializer_list<Operand>{
          {SPV_OPERAND_TYPE_ID, {var->result_id()}},
          {SPV_OPERAND_TYPE_ID, {index_id}},
      }));
  Instruction* inst = new_access_chain.get();
  context()->get_def_use_mgr()->AnalyzeInstDefUse(inst);
  insert_before->InsertBefore(std::move(new_access_chain));
  return inst;
}